

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_test(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSRefCountHeader *p;
  JSValueUnion JVar2;
  uint uVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  JVar5 = JS_RegExpExec(ctx,this_val,*argv);
  uVar3 = (uint)JVar5.tag;
  if (uVar3 == 6) {
    iVar4 = 6;
    JVar2.float64 = 0.0;
  }
  else {
    if ((0xfffffff4 < uVar3) && (iVar1 = *JVar5.u.ptr, *(int *)JVar5.u.ptr = iVar1 + -1, iVar1 < 2))
    {
      __JS_FreeValueRT(ctx->rt,JVar5);
    }
    JVar2._1_7_ = 0;
    JVar2.int32._0_1_ = uVar3 != 2;
    iVar4 = 1;
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_regexp_test(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValue val;
    BOOL ret;

    val = JS_RegExpExec(ctx, this_val, argv[0]);
    if (JS_IsException(val))
        return JS_EXCEPTION;
    ret = !JS_IsNull(val);
    JS_FreeValue(ctx, val);
    return JS_NewBool(ctx, ret);
}